

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall
kws::Parser::IsBetweenChars
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong in_RCX;
  char in_SIL;
  long in_RDI;
  byte in_R8B;
  string *in_R9;
  size_t b1;
  size_t b0;
  string stream;
  string local_b0 [32];
  string local_90 [32];
  ulong local_70;
  ulong local_68;
  undefined4 local_60;
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  size_t in_stack_ffffffffffffffc8;
  string *psVar5;
  undefined7 in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar2 = in_R8B & 1;
  psVar5 = in_R9;
  std::__cxx11::string::string(local_50,in_R9);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) &&
     (std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x518)), (bVar2 & 1) != 0)) {
    std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x4f8));
  }
  if (in_RCX == 0xffffffffffffffff) {
    local_1 = false;
  }
  else {
    local_68 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)in_SIL);
    std::__cxx11::string::string(local_90,in_R9);
    sVar4 = FindClosingChar((Parser *)CONCAT17(bVar2,in_stack_ffffffffffffffd8),
                            (char)((ulong)psVar5 >> 0x38),(char)((ulong)psVar5 >> 0x30),
                            in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,
                            in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_90);
    local_70 = sVar4;
    while( true ) {
      bVar1 = false;
      if ((local_68 != 0xffffffffffffffff) && (bVar1 = false, local_70 != 0xffffffffffffffff)) {
        bVar1 = local_68 < local_70;
      }
      if (!bVar1) {
        local_1 = false;
        goto LAB_0013a781;
      }
      if ((local_68 < in_RCX) && (in_RCX < local_70)) break;
      local_68 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)in_SIL);
      std::__cxx11::string::string(local_b0,in_R9);
      local_70 = FindClosingChar((Parser *)CONCAT17(bVar2,in_stack_ffffffffffffffd8),
                                 (char)((ulong)psVar5 >> 0x38),(char)((ulong)psVar5 >> 0x30),
                                 in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,
                                 in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_b0);
    }
    local_1 = true;
  }
LAB_0013a781:
  local_60 = 1;
  std::__cxx11::string::~string(local_50);
  return local_1;
}

Assistant:

bool Parser::IsBetweenChars(const char begin, const char end ,size_t pos,
                            bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);
    }
  return false;
}